

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scanner.c
# Opt level: O3

int yaml_parser_fetch_more_tokens(yaml_parser_t *parser)

{
  yaml_token_t **head;
  yaml_token_t **tail;
  yaml_simple_key_t **top;
  yaml_mark_t *pyVar1;
  size_t *psVar2;
  byte bVar3;
  yaml_encoding_t yVar4;
  yaml_mark_t start_mark_00;
  yaml_mark_t start_mark_01;
  yaml_mark_t start_mark_02;
  yaml_mark_t start_mark_03;
  undefined4 uVar5;
  int iVar6;
  int iVar7;
  yaml_simple_key_t *pyVar8;
  yaml_token_t *pyVar9;
  char *pcVar10;
  byte *pbVar11;
  byte bVar12;
  uint uVar13;
  size_t sVar14;
  long lVar15;
  yaml_token_type_t yVar16;
  yaml_token_t *pyVar17;
  yaml_char_t *ptr;
  byte bVar18;
  yaml_char_t *handle_value;
  yaml_mark_t start_mark;
  int major;
  undefined1 (*local_108) [16];
  undefined1 (*pauStack_100) [16];
  undefined1 (*pauStack_f8) [16];
  undefined1 (*local_f0) [16];
  yaml_mark_t *local_e8;
  yaml_mark_t *local_e0;
  size_t local_d8;
  size_t sStack_d0;
  size_t local_c8;
  yaml_char_t *local_c0;
  undefined1 (*local_b8) [16];
  yaml_token_t **local_b0;
  anon_struct_32_4_6186f7ca_for_tokens *local_a8;
  yaml_char_t *local_a0;
  int local_98;
  anon_struct_4_1_4deb52d1_for_stream_start local_94;
  anon_struct_24_3_654a3493_for_simple_keys *local_90;
  yaml_token_t local_88;
  yaml_simple_key_t **local_38;
  
  bVar18 = 0;
  head = &(parser->tokens).head;
  tail = &(parser->tokens).tail;
  local_90 = &parser->simple_keys;
  top = &(parser->simple_keys).top;
  pyVar1 = &parser->mark;
  local_e8 = &parser->context_mark;
  local_e0 = &parser->problem_mark;
  local_b0 = &(parser->tokens).end;
  local_a8 = &parser->tokens;
  local_38 = &(parser->simple_keys).end;
LAB_00104e1b:
  if (*head != *tail) {
    iVar6 = yaml_parser_stale_simple_keys(parser);
    if (iVar6 == 0) {
      return 0;
    }
    pyVar8 = local_90->start;
    while( true ) {
      if (pyVar8 == *top) {
        parser->token_available = 1;
        return 1;
      }
      if ((pyVar8->possible != 0) && (pyVar8->token_number == parser->tokens_parsed)) break;
      pyVar8 = pyVar8 + 1;
    }
  }
  if ((parser->unread == 0) && (iVar6 = yaml_parser_update_buffer(parser,1), iVar6 == 0)) {
    return 0;
  }
  if (parser->stream_start_produced != 0) {
LAB_00104e9d:
    if ((parser->unread == 0) && (iVar6 = yaml_parser_update_buffer(parser,1), iVar6 == 0)) {
      return 0;
    }
    if (((parser->mark).column == 0) &&
       (((pbVar11 = (parser->buffer).pointer, *pbVar11 == 0xef && (pbVar11[1] == 0xbb)) &&
        (pbVar11[2] == 0xbf)))) {
      (parser->mark).index = (parser->mark).index + 1;
      (parser->mark).column = 1;
      parser->unread = parser->unread - 1;
      bVar12 = *pbVar11;
      lVar15 = 1;
      if ((((char)bVar12 < '\0') && (lVar15 = 2, (bVar12 & 0xe0) != 0xc0)) &&
         (lVar15 = 3, (bVar12 & 0xf0) != 0xe0)) {
        lVar15 = (ulong)((bVar12 & 0xf8) == 0xf0) << 2;
      }
      (parser->buffer).pointer = pbVar11 + lVar15;
    }
    sVar14 = parser->unread;
    do {
      if ((sVar14 == 0) && (iVar6 = yaml_parser_update_buffer(parser,1), iVar6 == 0)) {
        return 0;
      }
      pbVar11 = (parser->buffer).pointer;
      bVar12 = *pbVar11;
      uVar13 = (uint)bVar12;
      if (bVar12 != 0x20) {
        if (parser->flow_level == 0) {
          if ((bVar12 != 9) || (parser->simple_key_allowed != 0)) goto joined_r0x00105024;
        }
        else if (bVar12 != 9) goto joined_r0x00105024;
      }
      (parser->mark).index = (parser->mark).index + 1;
      psVar2 = &(parser->mark).column;
      *psVar2 = *psVar2 + 1;
      sVar14 = parser->unread - 1;
      parser->unread = sVar14;
      bVar12 = *pbVar11;
      lVar15 = 1;
      if ((((char)bVar12 < '\0') && (lVar15 = 2, (bVar12 & 0xe0) != 0xc0)) &&
         (lVar15 = 3, (bVar12 & 0xf0) != 0xe0)) {
        lVar15 = (ulong)((bVar12 & 0xf8) == 0xf0) << 2;
      }
      (parser->buffer).pointer = pbVar11 + lVar15;
    } while( true );
  }
  parser->indent = -1;
  pyVar8 = (parser->simple_keys).top;
  if (pyVar8 == (parser->simple_keys).end) {
    iVar6 = yaml_stack_extend(&local_90->start,top,local_38);
    if (iVar6 != 0) {
      pyVar8 = *top;
      goto LAB_001052eb;
    }
    parser->error = YAML_MEMORY_ERROR;
    iVar7 = 0;
  }
  else {
LAB_001052eb:
    (parser->simple_keys).top = pyVar8 + 1;
    (pyVar8->mark).index = 0;
    (pyVar8->mark).line = 0;
    pyVar8->possible = 0;
    pyVar8->required = 0;
    pyVar8->token_number = 0;
    (pyVar8->mark).column = 0;
    parser->simple_key_allowed = 1;
    parser->stream_start_produced = 1;
    local_88.type = YAML_NO_TOKEN;
    local_88._4_4_ = 0;
    local_88.data.version_directive.major = YAML_ANY_ENCODING;
    local_88.data.version_directive.minor = 0;
    local_88.data.scalar.length._0_4_ = 0;
    sVar14 = (parser->mark).column;
    local_88.start_mark.index._4_4_ = (undefined4)sVar14;
    local_88.start_mark.line._0_4_ = (undefined4)(sVar14 >> 0x20);
    sVar14 = (parser->mark).line;
    local_88.data.scalar.length._4_4_ = (undefined4)pyVar1->index;
    local_88.data.scalar.style = (yaml_scalar_style_t)(pyVar1->index >> 0x20);
    local_88.data._20_4_ = (undefined4)sVar14;
    local_88.start_mark.index._0_4_ = (undefined4)(sVar14 >> 0x20);
    pauStack_f8 = (undefined1 (*) [16])(parser->mark).column;
    local_108 = (undefined1 (*) [16])pyVar1->index;
    pauStack_100 = (undefined1 (*) [16])(parser->mark).line;
    yVar4 = parser->encoding;
    pyVar9 = (parser->tokens).tail;
    if (pyVar9 == (parser->tokens).end) {
      iVar6 = yaml_queue_extend(&local_a8->start,head,tail,local_b0);
      if (iVar6 == 0) {
        parser->error = YAML_MEMORY_ERROR;
        iVar7 = 0;
        goto LAB_001053ea;
      }
      pyVar9 = *tail;
    }
    *tail = pyVar9 + 1;
    *(undefined8 *)pyVar9 = 1;
    (pyVar9->data).stream_start.encoding = yVar4;
    *(ulong *)((long)&(pyVar9->data).alias.value + 4) = CONCAT44(local_88._4_4_,local_88.type);
    *(ulong *)((long)&(pyVar9->data).scalar.length + 4) =
         CONCAT44(local_88.data.version_directive.minor,local_88.data.version_directive.major);
    *(ulong *)((long)&pyVar9->data + 0x14) =
         CONCAT44(local_88.data.scalar.length._4_4_,local_88.data.scalar.length._0_4_);
    *(ulong *)((long)&(pyVar9->start_mark).index + 4) =
         CONCAT44(local_88.data._20_4_,local_88.data.scalar.style);
    (pyVar9->start_mark).line = CONCAT44((undefined4)local_88.start_mark.index,local_88.data._20_4_)
    ;
    (pyVar9->start_mark).column =
         CONCAT44((undefined4)local_88.start_mark.line,local_88.start_mark.index._4_4_);
    (pyVar9->end_mark).index = (size_t)local_108;
    (pyVar9->end_mark).line = (size_t)pauStack_100;
    (pyVar9->end_mark).column = (size_t)pauStack_f8;
    iVar7 = 1;
  }
  goto LAB_001053ea;
joined_r0x00105024:
  if (bVar12 == 0x23) {
    uVar13 = 0x23;
    do {
      if ((char)uVar13 == -0x3e) {
        if (pbVar11[1] == 0x85) {
          bVar12 = 0xc2;
          goto LAB_00105156;
        }
      }
      else if (((uVar13 != 0xe2) && (uVar13 < 0xe)) && ((0x2401U >> (uVar13 & 0x1f) & 1) != 0))
      break;
      (parser->mark).index = (parser->mark).index + 1;
      psVar2 = &(parser->mark).column;
      *psVar2 = *psVar2 + 1;
      sVar14 = parser->unread - 1;
      parser->unread = sVar14;
      bVar12 = *pbVar11;
      lVar15 = 1;
      if ((((char)bVar12 < '\0') && (lVar15 = 2, (bVar12 & 0xe0) != 0xc0)) &&
         (lVar15 = 3, (bVar12 & 0xf0) != 0xe0)) {
        lVar15 = (ulong)((bVar12 & 0xf8) == 0xf0) << 2;
      }
      pbVar11 = pbVar11 + lVar15;
      (parser->buffer).pointer = pbVar11;
      if (sVar14 == 0) {
        iVar6 = yaml_parser_update_buffer(parser,1);
        if (iVar6 == 0) {
          return 0;
        }
        pbVar11 = (parser->buffer).pointer;
      }
      uVar13 = (uint)*pbVar11;
    } while( true );
  }
  bVar12 = (byte)uVar13;
  if (uVar13 < 0xc2) {
    if ((uVar13 != 10) && (uVar13 != 0xd)) goto LAB_0010541d;
  }
  else if (((uVar13 == 0xe2) || (uVar13 != 0xc2)) || (bVar12 = 0xc2, pbVar11[1] != 0x85))
  goto LAB_0010541d;
LAB_00105156:
  if (parser->unread < 2) {
    iVar6 = yaml_parser_update_buffer(parser,2);
    if (iVar6 == 0) {
      return 0;
    }
    pbVar11 = (parser->buffer).pointer;
    bVar12 = *pbVar11;
  }
  if (bVar12 < 0xc2) {
    if (bVar12 == 10) goto LAB_00105204;
    if (bVar12 != 0xd) goto LAB_00105279;
    if (pbVar11[1] != 10) goto LAB_00105204;
    (parser->mark).column = 0;
    (parser->mark).index = (parser->mark).index + 2;
    (parser->mark).line = (parser->mark).line + 1;
    parser->unread = parser->unread - 2;
    lVar15 = 2;
  }
  else {
    if ((bVar12 != 0xc2) || (pbVar11[1] != 0x85)) goto LAB_00105279;
LAB_00105204:
    (parser->mark).column = 0;
    (parser->mark).index = (parser->mark).index + 1;
    (parser->mark).line = (parser->mark).line + 1;
    parser->unread = parser->unread - 1;
    bVar12 = *pbVar11;
    lVar15 = 1;
    if ((((char)bVar12 < '\0') && (lVar15 = 2, (bVar12 & 0xe0) != 0xc0)) &&
       (lVar15 = 3, (bVar12 & 0xf0) != 0xe0)) {
      lVar15 = (ulong)((bVar12 & 0xf8) == 0xf0) << 2;
    }
  }
  (parser->buffer).pointer = pbVar11 + lVar15;
LAB_00105279:
  if (parser->flow_level == 0) {
    parser->simple_key_allowed = 1;
  }
  goto LAB_00104e9d;
LAB_0010541d:
  iVar6 = yaml_parser_stale_simple_keys(parser);
  if (iVar6 == 0) {
    return 0;
  }
  iVar6 = yaml_parser_unroll_indent(parser,(parser->mark).column);
  if (iVar6 == 0) {
    return 0;
  }
  if ((parser->unread < 4) && (iVar6 = yaml_parser_update_buffer(parser,4), iVar6 == 0)) {
    return 0;
  }
  pbVar11 = (parser->buffer).pointer;
  bVar12 = *pbVar11;
  if (bVar12 == 0) {
    if ((parser->mark).column != 0) {
      (parser->mark).column = 0;
      psVar2 = &(parser->mark).line;
      *psVar2 = *psVar2 + 1;
    }
    iVar6 = yaml_parser_unroll_indent(parser,-1);
    iVar7 = 0;
    if (iVar6 == 0) goto LAB_001053ea;
    pyVar8 = *top;
    if ((pyVar8[-1].possible != 0) && (pyVar8[-1].required != 0)) {
LAB_001055f1:
      iVar7 = 0;
      pauStack_f8 = (undefined1 (*) [16])pyVar8[-1].mark.column;
      local_108 = (undefined1 (*) [16])pyVar8[-1].mark.index;
      pauStack_100 = (undefined1 (*) [16])pyVar8[-1].mark.line;
      parser->error = YAML_SCANNER_ERROR;
      parser->context = "while scanning a simple key";
      local_e8->column = (size_t)pauStack_f8;
      local_e8->index = (size_t)local_108;
      local_e8->line = (size_t)pauStack_100;
      parser->problem = "could not find expected \':\'";
      local_e0->column = (parser->mark).column;
      sVar14 = (parser->mark).line;
      local_e0->index = pyVar1->index;
      local_e0->line = sVar14;
      goto LAB_001053ea;
    }
    pyVar8[-1].possible = 0;
    parser->simple_key_allowed = 0;
    local_88.data.scalar.length._0_4_ = 0;
    local_88.data.scalar.length._4_4_ = 0;
    local_88.data.scalar.style = YAML_ANY_SCALAR_STYLE;
    local_88.type = YAML_NO_TOKEN;
    local_88._4_4_ = 0;
    local_88.data.version_directive.major = YAML_ANY_ENCODING;
    local_88.data.version_directive.minor = 0;
    sVar14 = (parser->mark).column;
    local_88.start_mark.line._4_4_ = (undefined4)sVar14;
    local_88.start_mark.column._0_4_ = (undefined4)(sVar14 >> 0x20);
    sVar14 = (parser->mark).line;
    local_88.data._20_4_ = (undefined4)pyVar1->index;
    local_88.start_mark.index._0_4_ = (undefined4)(pyVar1->index >> 0x20);
    local_88.start_mark.index._4_4_ = (undefined4)sVar14;
    local_88.start_mark.line._0_4_ = (undefined4)(sVar14 >> 0x20);
    pauStack_f8 = (undefined1 (*) [16])(parser->mark).column;
    local_108 = (undefined1 (*) [16])pyVar1->index;
    pauStack_100 = (undefined1 (*) [16])(parser->mark).line;
    pyVar9 = (parser->tokens).tail;
    if (pyVar9 == (parser->tokens).end) {
      iVar6 = yaml_queue_extend(&local_a8->start,head,tail,local_b0);
      if (iVar6 == 0) {
        parser->error = YAML_MEMORY_ERROR;
        goto LAB_00105d4c;
      }
      pyVar9 = *tail;
    }
    *tail = pyVar9 + 1;
    pyVar9->type = YAML_STREAM_END_TOKEN;
    *(ulong *)&pyVar9->field_0x4 = CONCAT44(local_88._4_4_,local_88.type);
    *(ulong *)((long)&(pyVar9->data).alias.value + 4) =
         CONCAT44(local_88.data.version_directive.minor,local_88.data.version_directive.major);
    *(ulong *)((long)&(pyVar9->data).scalar.length + 4) =
         CONCAT44(local_88.data.scalar.length._4_4_,local_88.data.scalar.length._0_4_);
    *(ulong *)((long)&pyVar9->data + 0x14) =
         CONCAT44(local_88.data._20_4_,local_88.data.scalar.style);
    *(ulong *)((long)&(pyVar9->start_mark).index + 4) =
         CONCAT44(local_88.start_mark.index._4_4_,(undefined4)local_88.start_mark.index);
    *(ulong *)((long)&(pyVar9->start_mark).line + 4) =
         CONCAT44(local_88.start_mark.line._4_4_,(undefined4)local_88.start_mark.line);
    *(undefined4 *)((long)&(pyVar9->start_mark).column + 4) = (undefined4)local_88.start_mark.column
    ;
    (pyVar9->end_mark).index = (size_t)local_108;
    (pyVar9->end_mark).line = (size_t)pauStack_100;
    (pyVar9->end_mark).column = (size_t)pauStack_f8;
    iVar7 = 1;
    goto LAB_001053ea;
  }
  sVar14 = (parser->mark).column;
  if (bVar12 == 0x25 && sVar14 == 0) {
    iVar6 = yaml_parser_unroll_indent(parser,-1);
    iVar7 = 0;
    if (iVar6 == 0) goto LAB_001053ea;
    pyVar8 = *top;
    if ((pyVar8[-1].possible != 0) && (pyVar8[-1].required != 0)) goto LAB_001055f1;
    pyVar8[-1].possible = 0;
    parser->simple_key_allowed = 0;
    local_d8 = pyVar1->index;
    sStack_d0 = (parser->mark).line;
    local_c8 = (parser->mark).column;
    (parser->mark).index = (parser->mark).index + 1;
    psVar2 = &(parser->mark).column;
    *psVar2 = *psVar2 + 1;
    parser->unread = parser->unread - 1;
    pbVar11 = (parser->buffer).pointer;
    bVar12 = *pbVar11;
    lVar15 = 1;
    if ((((char)bVar12 < '\0') && (lVar15 = 2, (bVar12 & 0xe0) != 0xc0)) &&
       (lVar15 = 3, (bVar12 & 0xf0) != 0xe0)) {
      lVar15 = (ulong)((bVar12 & 0xf8) == 0xf0) << 2;
    }
    (parser->buffer).pointer = pbVar11 + lVar15;
    pauStack_100 = (undefined1 (*) [16])0x0;
    pauStack_f8 = (undefined1 (*) [16])0x0;
    local_108 = (undefined1 (*) [16])yaml_malloc(0x10);
    if (local_108 == (undefined1 (*) [16])0x0) {
LAB_00105d0c:
      parser->error = YAML_MEMORY_ERROR;
LAB_00105d12:
      yaml_free(local_108);
      local_b8 = (undefined1 (*) [16])0x0;
      local_f0 = (undefined1 (*) [16])0x0;
      ptr = (yaml_char_t *)0x0;
    }
    else {
      pauStack_100 = local_108 + 1;
      *local_108 = (undefined1  [16])0x0;
      sVar14 = parser->unread;
      pauStack_f8 = local_108;
      while( true ) {
        if ((sVar14 == 0) && (iVar6 = yaml_parser_update_buffer(parser,1), iVar6 == 0))
        goto LAB_00105d12;
        pbVar11 = (parser->buffer).pointer;
        bVar12 = *pbVar11;
        if (((9 < (byte)(bVar12 - 0x30)) &&
            ((0x19 < (byte)((bVar12 & 0xdf) + 0xbf) && (bVar12 != 0x5f)))) && (bVar12 != 0x2d))
        break;
        if (pauStack_100 <= (undefined1 (*) [16])(*pauStack_f8 + 5)) {
          iVar6 = yaml_string_extend((yaml_char_t **)&local_108,(yaml_char_t **)&pauStack_f8,
                                     (yaml_char_t **)&pauStack_100);
          if (iVar6 == 0) goto LAB_00105d0c;
          pbVar11 = (parser->buffer).pointer;
          bVar12 = *pbVar11;
        }
        if ((char)bVar12 < '\0') {
          if ((bVar12 & 0xe0) == 0xc0) {
LAB_00105cab:
            (parser->buffer).pointer = pbVar11 + 1;
            (*pauStack_f8)[0] = *pbVar11;
            pbVar11 = (parser->buffer).pointer;
            pauStack_f8 = (undefined1 (*) [16])(*pauStack_f8 + 1);
            goto LAB_00105ccf;
          }
          if ((bVar12 & 0xf0) == 0xe0) {
LAB_00105c87:
            (parser->buffer).pointer = pbVar11 + 1;
            (*pauStack_f8)[0] = *pbVar11;
            pbVar11 = (parser->buffer).pointer;
            pauStack_f8 = (undefined1 (*) [16])(*pauStack_f8 + 1);
            goto LAB_00105cab;
          }
          if ((bVar12 & 0xf8) == 0xf0) {
            (parser->buffer).pointer = pbVar11 + 1;
            (*pauStack_f8)[0] = *pbVar11;
            pbVar11 = (parser->buffer).pointer;
            pauStack_f8 = (undefined1 (*) [16])(*pauStack_f8 + 1);
            goto LAB_00105c87;
          }
        }
        else {
LAB_00105ccf:
          (parser->buffer).pointer = pbVar11 + 1;
          (*pauStack_f8)[0] = *pbVar11;
          pauStack_f8 = (undefined1 (*) [16])(*pauStack_f8 + 1);
        }
        (parser->mark).index = (parser->mark).index + 1;
        psVar2 = &(parser->mark).column;
        *psVar2 = *psVar2 + 1;
        psVar2 = &parser->unread;
        *psVar2 = *psVar2 - 1;
        sVar14 = *psVar2;
      }
      if (local_108 == pauStack_f8) {
        parser->error = YAML_SCANNER_ERROR;
        parser->context = "while scanning a directive";
        local_e8->column = local_c8;
        local_e8->index = local_d8;
        local_e8->line = sStack_d0;
        pcVar10 = "could not find expected directive name";
LAB_00105ed0:
        parser->problem = pcVar10;
        local_e0->column = (parser->mark).column;
        sVar14 = (parser->mark).line;
        local_e0->index = pyVar1->index;
        local_e0->line = sVar14;
        goto LAB_00105d12;
      }
      uVar13 = (uint)bVar12;
      if (((0x20 < uVar13) || ((0x100002601U >> ((ulong)uVar13 & 0x3f) & 1) == 0)) &&
         ((uVar13 == 0xe2 || ((uVar13 != 0xc2 || (pbVar11[1] != 0x85)))))) {
        parser->error = YAML_SCANNER_ERROR;
        parser->context = "while scanning a directive";
        local_e8->column = local_c8;
        local_e8->index = local_d8;
        local_e8->line = sStack_d0;
        pcVar10 = "found unexpected non-alphabetical character";
        goto LAB_00105ed0;
      }
      local_b8 = local_108;
      iVar6 = strcmp((char *)local_108,"YAML");
      if (iVar6 == 0) {
        sVar14 = parser->unread;
        while( true ) {
          if ((sVar14 == 0) && (iVar6 = yaml_parser_update_buffer(parser,1), iVar6 == 0))
          goto LAB_00106434;
          pbVar11 = (parser->buffer).pointer;
          if ((*pbVar11 != 0x20) && (*pbVar11 != 9)) break;
          (parser->mark).index = (parser->mark).index + 1;
          psVar2 = &(parser->mark).column;
          *psVar2 = *psVar2 + 1;
          sVar14 = parser->unread - 1;
          parser->unread = sVar14;
          bVar12 = *pbVar11;
          lVar15 = 1;
          if ((((char)bVar12 < '\0') && (lVar15 = 2, (bVar12 & 0xe0) != 0xc0)) &&
             (lVar15 = 3, (bVar12 & 0xf0) != 0xe0)) {
            lVar15 = (ulong)((bVar12 & 0xf8) == 0xf0) << 2;
          }
          (parser->buffer).pointer = pbVar11 + lVar15;
        }
        start_mark_02.line = sStack_d0;
        start_mark_02.index = local_d8;
        start_mark_02.column = local_c8;
        iVar6 = yaml_parser_scan_version_directive_number(parser,start_mark_02,(int *)&local_94);
        if (iVar6 == 0) goto LAB_00106434;
        pbVar11 = (parser->buffer).pointer;
        if (*pbVar11 != 0x2e) {
          parser->error = YAML_SCANNER_ERROR;
          parser->context = "while scanning a %YAML directive";
          local_e8->column = local_c8;
          local_e8->index = local_d8;
          local_e8->line = sStack_d0;
          pcVar10 = "did not find expected digit or \'.\' character";
          goto LAB_00105de7;
        }
        (parser->mark).index = (parser->mark).index + 1;
        psVar2 = &(parser->mark).column;
        *psVar2 = *psVar2 + 1;
        parser->unread = parser->unread - 1;
        bVar12 = *pbVar11;
        lVar15 = 1;
        if ((((char)bVar12 < '\0') && (lVar15 = 2, (bVar12 & 0xe0) != 0xc0)) &&
           (lVar15 = 3, (bVar12 & 0xf0) != 0xe0)) {
          lVar15 = (ulong)((bVar12 & 0xf8) == 0xf0) << 2;
        }
        (parser->buffer).pointer = pbVar11 + lVar15;
        start_mark_03.line = sStack_d0;
        start_mark_03.index = local_d8;
        start_mark_03.column = local_c8;
        iVar6 = yaml_parser_scan_version_directive_number(parser,start_mark_03,&local_98);
        if (iVar6 == 0) goto LAB_00106434;
        local_88.data.scalar.length._0_4_ = 0;
        local_88.data.scalar.length._4_4_ = 0;
        local_88.type = YAML_VERSION_DIRECTIVE_TOKEN;
        local_88.start_mark.column._0_4_ = (undefined4)local_c8;
        local_88.start_mark.column._4_4_ = (undefined4)(local_c8 >> 0x20);
        local_88.start_mark.index._0_4_ = (undefined4)local_d8;
        local_88.start_mark.index._4_4_ = (undefined4)(local_d8 >> 0x20);
        local_88.start_mark.line._0_4_ = (undefined4)sStack_d0;
        local_88.start_mark.line._4_4_ = (undefined4)(sStack_d0 >> 0x20);
        local_88.end_mark.column = (parser->mark).column;
        local_88.end_mark.index = pyVar1->index;
        local_88.end_mark.line = (parser->mark).line;
        local_88.data.stream_start.encoding =
             (anon_struct_4_1_4deb52d1_for_stream_start)
             (anon_struct_4_1_4deb52d1_for_stream_start)local_94.encoding;
        local_88.data.version_directive.minor = local_98;
        local_f0 = (undefined1 (*) [16])0x0;
        local_c0 = (yaml_char_t *)0x0;
LAB_00106428:
        local_88.data._20_4_ = 0;
        local_88.data.scalar.style = YAML_ANY_SCALAR_STYLE;
        local_88._4_4_ = 0;
        sVar14 = parser->unread;
        while( true ) {
          if ((sVar14 == 0) &&
             (iVar6 = yaml_parser_update_buffer(parser,1), ptr = local_c0, iVar6 == 0))
          goto LAB_00105d30;
          pbVar11 = (parser->buffer).pointer;
          bVar12 = *pbVar11;
          uVar13 = (uint)bVar12;
          if ((bVar12 != 9) && (bVar12 != 0x20)) break;
          (parser->mark).index = (parser->mark).index + 1;
          psVar2 = &(parser->mark).column;
          *psVar2 = *psVar2 + 1;
          sVar14 = parser->unread - 1;
          parser->unread = sVar14;
          bVar12 = *pbVar11;
          lVar15 = 1;
          if ((((char)bVar12 < '\0') && (lVar15 = 2, (bVar12 & 0xe0) != 0xc0)) &&
             (lVar15 = 3, (bVar12 & 0xf0) != 0xe0)) {
            lVar15 = (ulong)((bVar12 & 0xf8) == 0xf0) << 2;
          }
          (parser->buffer).pointer = pbVar11 + lVar15;
        }
        if (bVar12 == 0x23) {
          do {
            if ((char)uVar13 == -0x3e) {
              if (pbVar11[1] == 0x85) {
                bVar12 = 0xc2;
                goto LAB_00106657;
              }
            }
            else if (((uVar13 != 0xe2) && (uVar13 < 0xe)) && ((0x2401U >> (uVar13 & 0x1f) & 1) != 0)
                    ) break;
            (parser->mark).index = (parser->mark).index + 1;
            psVar2 = &(parser->mark).column;
            *psVar2 = *psVar2 + 1;
            sVar14 = parser->unread - 1;
            parser->unread = sVar14;
            bVar12 = *pbVar11;
            lVar15 = 1;
            if ((((char)bVar12 < '\0') && (lVar15 = 2, (bVar12 & 0xe0) != 0xc0)) &&
               (lVar15 = 3, (bVar12 & 0xf0) != 0xe0)) {
              lVar15 = (ulong)((bVar12 & 0xf8) == 0xf0) << 2;
            }
            pbVar11 = pbVar11 + lVar15;
            (parser->buffer).pointer = pbVar11;
            if (sVar14 == 0) {
              iVar6 = yaml_parser_update_buffer(parser,1);
              ptr = local_c0;
              if (iVar6 == 0) goto LAB_00105d30;
              pbVar11 = (parser->buffer).pointer;
            }
            uVar13 = (uint)*pbVar11;
          } while( true );
        }
        bVar12 = (byte)uVar13;
        if (uVar13 < 0xd) {
          if (uVar13 != 0) {
            if (uVar13 == 10) goto LAB_00106657;
            goto LAB_001066df;
          }
LAB_001067df:
          yaml_free(local_b8);
          pyVar9 = *tail;
          if (pyVar9 == *local_b0) {
            iVar6 = yaml_queue_extend(&local_a8->start,head,tail,local_b0);
            if (iVar6 == 0) {
              parser->error = YAML_MEMORY_ERROR;
              yaml_token_delete(&local_88);
              goto LAB_00105d4c;
            }
            pyVar9 = *tail;
          }
          *tail = pyVar9 + 1;
          pyVar17 = &local_88;
          for (lVar15 = 10; lVar15 != 0; lVar15 = lVar15 + -1) {
            uVar5 = *(undefined4 *)&pyVar17->field_0x4;
            pyVar9->type = pyVar17->type;
            *(undefined4 *)&pyVar9->field_0x4 = uVar5;
            pyVar17 = (yaml_token_t *)((long)pyVar17 + ((ulong)bVar18 * -2 + 1) * 8);
            pyVar9 = (yaml_token_t *)((long)pyVar9 + (ulong)bVar18 * -0x10 + 8);
          }
          iVar7 = 1;
          goto LAB_001053ea;
        }
        if ((uVar13 == 0xd) ||
           (((uVar13 != 0xe2 && (uVar13 == 0xc2)) && (bVar12 = 0xc2, pbVar11[1] == 0x85)))) {
LAB_00106657:
          if (parser->unread < 2) {
            iVar6 = yaml_parser_update_buffer(parser,2);
            ptr = local_c0;
            if (iVar6 == 0) goto LAB_00105d30;
            pbVar11 = (parser->buffer).pointer;
            bVar12 = *pbVar11;
          }
          if (bVar12 < 0xc2) {
            if (bVar12 == 10) goto LAB_0010676a;
            if (bVar12 != 0xd) goto LAB_001067df;
            if (pbVar11[1] != 10) goto LAB_0010676a;
            (parser->mark).column = 0;
            (parser->mark).index = (parser->mark).index + 2;
            (parser->mark).line = (parser->mark).line + 1;
            parser->unread = parser->unread - 2;
            lVar15 = 2;
          }
          else {
            if ((bVar12 != 0xc2) || (pbVar11[1] != 0x85)) goto LAB_001067df;
LAB_0010676a:
            (parser->mark).column = 0;
            (parser->mark).index = (parser->mark).index + 1;
            (parser->mark).line = (parser->mark).line + 1;
            parser->unread = parser->unread - 1;
            bVar12 = *pbVar11;
            lVar15 = 1;
            if ((((char)bVar12 < '\0') && (lVar15 = 2, (bVar12 & 0xe0) != 0xc0)) &&
               (lVar15 = 3, (bVar12 & 0xf0) != 0xe0)) {
              lVar15 = (ulong)((bVar12 & 0xf8) == 0xf0) << 2;
            }
          }
          (parser->buffer).pointer = pbVar11 + lVar15;
          goto LAB_001067df;
        }
LAB_001066df:
        parser->error = YAML_SCANNER_ERROR;
        parser->context = "while scanning a directive";
        local_e8->column = local_c8;
        local_e8->index = local_d8;
        local_e8->line = sStack_d0;
        parser->problem = "did not find expected comment or line break";
        local_e0->column = (parser->mark).column;
        sVar14 = (parser->mark).line;
        local_e0->index = pyVar1->index;
        local_e0->line = sVar14;
        ptr = local_c0;
      }
      else {
        iVar6 = strcmp((char *)local_b8,"TAG");
        if (iVar6 == 0) {
          local_108 = (undefined1 (*) [16])0x0;
          local_a0 = (yaml_char_t *)0x0;
          sVar14 = parser->unread;
          while( true ) {
            if ((sVar14 == 0) && (iVar6 = yaml_parser_update_buffer(parser,1), iVar6 == 0))
            goto LAB_00106224;
            pbVar11 = (parser->buffer).pointer;
            if ((*pbVar11 != 0x20) && (*pbVar11 != 9)) break;
            (parser->mark).index = (parser->mark).index + 1;
            psVar2 = &(parser->mark).column;
            *psVar2 = *psVar2 + 1;
            sVar14 = parser->unread - 1;
            parser->unread = sVar14;
            bVar12 = *pbVar11;
            lVar15 = 1;
            if ((((char)bVar12 < '\0') && (lVar15 = 2, (bVar12 & 0xe0) != 0xc0)) &&
               (lVar15 = 3, (bVar12 & 0xf0) != 0xe0)) {
              lVar15 = (ulong)((bVar12 & 0xf8) == 0xf0) << 2;
            }
            (parser->buffer).pointer = pbVar11 + lVar15;
          }
          start_mark_00.line = sStack_d0;
          start_mark_00.index = local_d8;
          start_mark_00.column = local_c8;
          iVar6 = yaml_parser_scan_tag_handle(parser,1,start_mark_00,(yaml_char_t **)&local_108);
          if ((iVar6 != 0) &&
             ((parser->unread != 0 || (iVar6 = yaml_parser_update_buffer(parser,1), iVar6 != 0)))) {
            pbVar11 = (parser->buffer).pointer;
            bVar12 = *pbVar11;
            if ((bVar12 == 0x20) || (pcVar10 = "did not find expected whitespace", bVar12 == 9)) {
              while ((bVar12 == 0x20 || (bVar12 == 9))) {
                (parser->mark).index = (parser->mark).index + 1;
                psVar2 = &(parser->mark).column;
                *psVar2 = *psVar2 + 1;
                sVar14 = parser->unread - 1;
                parser->unread = sVar14;
                bVar12 = *pbVar11;
                lVar15 = 1;
                if (((char)bVar12 < '\0') &&
                   ((lVar15 = 2, (bVar12 & 0xe0) != 0xc0 && (lVar15 = 3, (bVar12 & 0xf0) != 0xe0))))
                {
                  lVar15 = (ulong)((bVar12 & 0xf8) == 0xf0) << 2;
                }
                pbVar11 = pbVar11 + lVar15;
                (parser->buffer).pointer = pbVar11;
                if (sVar14 == 0) {
                  iVar6 = yaml_parser_update_buffer(parser,1);
                  if (iVar6 == 0) goto LAB_00106224;
                  pbVar11 = (parser->buffer).pointer;
                }
                bVar12 = *pbVar11;
              }
              start_mark_01.line = sStack_d0;
              start_mark_01.index = local_d8;
              start_mark_01.column = local_c8;
              iVar6 = yaml_parser_scan_tag_uri(parser,1,(yaml_char_t *)0x0,start_mark_01,&local_a0);
              if ((iVar6 != 0) &&
                 ((parser->unread != 0 || (iVar6 = yaml_parser_update_buffer(parser,1), iVar6 != 0))
                 )) {
                pbVar11 = (parser->buffer).pointer;
                bVar12 = *pbVar11;
                if ((0x20 < (ulong)bVar12) || ((0x100002601U >> ((ulong)bVar12 & 0x3f) & 1) == 0)) {
                  if (bVar12 == 0xe2) {
                    pcVar10 = "did not find expected whitespace or line break";
                    goto LAB_001061e1;
                  }
                  pcVar10 = "did not find expected whitespace or line break";
                  if ((bVar12 != 0xc2) ||
                     (pcVar10 = "did not find expected whitespace or line break", pbVar11[1] != 0x85
                     )) goto LAB_001061e1;
                }
                local_88.type = YAML_TAG_DIRECTIVE_TOKEN;
                local_88.start_mark.column._0_4_ = (undefined4)local_c8;
                local_88.start_mark.column._4_4_ = (undefined4)(local_c8 >> 0x20);
                local_88.start_mark.index._0_4_ = (undefined4)local_d8;
                local_88.start_mark.index._4_4_ = (undefined4)(local_d8 >> 0x20);
                local_88.start_mark.line._0_4_ = (undefined4)sStack_d0;
                local_88.start_mark.line._4_4_ = (undefined4)(sStack_d0 >> 0x20);
                local_88.end_mark.column = (parser->mark).column;
                local_88.end_mark.index = pyVar1->index;
                local_88.end_mark.line = (parser->mark).line;
                local_f0 = local_108;
                local_88.data.version_directive.major = (int)local_108;
                local_88.data.version_directive.minor = (int)((ulong)local_108 >> 0x20);
                local_c0 = local_a0;
                local_88.data.scalar.length._0_4_ = SUB84(local_a0,0);
                local_88.data.scalar.length._4_4_ = (undefined4)((ulong)local_a0 >> 0x20);
                goto LAB_00106428;
              }
            }
            else {
LAB_001061e1:
              parser->error = YAML_SCANNER_ERROR;
              parser->context = "while scanning a %TAG directive";
              local_e8->column = local_c8;
              local_e8->index = local_d8;
              local_e8->line = sStack_d0;
              parser->problem = pcVar10;
              local_e0->column = (parser->mark).column;
              sVar14 = (parser->mark).line;
              local_e0->index = pyVar1->index;
              local_e0->line = sVar14;
            }
          }
LAB_00106224:
          yaml_free(local_108);
          yaml_free(local_a0);
        }
        else {
          parser->error = YAML_SCANNER_ERROR;
          parser->context = "while scanning a directive";
          local_e8->column = local_c8;
          local_e8->index = local_d8;
          local_e8->line = sStack_d0;
          pcVar10 = "found unknown directive name";
LAB_00105de7:
          parser->problem = pcVar10;
          local_e0->column = (parser->mark).column;
          sVar14 = (parser->mark).line;
          local_e0->index = pyVar1->index;
          local_e0->line = sVar14;
        }
LAB_00106434:
        local_f0 = (undefined1 (*) [16])0x0;
        ptr = (yaml_char_t *)0x0;
      }
    }
LAB_00105d30:
    yaml_free(ptr);
    yaml_free(local_f0);
    yaml_free(local_b8);
LAB_00105d4c:
    iVar7 = 0;
    goto LAB_001053ea;
  }
  if (sVar14 == 0) {
    if (bVar12 < 0x5b) {
      switch(bVar12) {
      case 0x20:
      case 0x23:
      case 0x25:
      case 0x40:
        goto switchD_0010567e_caseD_20;
      case 0x21:
        goto switchD_0010567e_caseD_21;
      case 0x22:
        goto switchD_0010567e_caseD_22;
      case 0x24:
      case 0x28:
      case 0x29:
      case 0x2b:
      case 0x2f:
      case 0x30:
      case 0x31:
      case 0x32:
      case 0x33:
      case 0x34:
      case 0x35:
      case 0x36:
      case 0x37:
      case 0x38:
      case 0x39:
      case 0x3b:
      case 0x3c:
      case 0x3d:
        break;
      case 0x26:
        goto switchD_0010567e_caseD_26;
      case 0x27:
        goto switchD_0010567e_caseD_27;
      case 0x2a:
        goto switchD_0010567e_caseD_2a;
      case 0x2c:
        goto switchD_0010567e_caseD_2c;
      case 0x2d:
        bVar12 = pbVar11[1];
        if (bVar12 != 0x2d) goto LAB_00105a50;
        if (pbVar11[2] == 0x2d) {
          bVar12 = pbVar11[3];
          if ((((ulong)bVar12 < 0x21) && ((0x100002601U >> ((ulong)bVar12 & 0x3f) & 1) != 0)) ||
             ((bVar12 != 0xe2 && ((bVar12 == 0xc2 && (pbVar11[4] == 0x85)))))) {
            yVar16 = YAML_DOCUMENT_START_TOKEN;
            goto LAB_00105a49;
          }
        }
        break;
      case 0x2e:
        if ((pbVar11[1] == 0x2e) && (pbVar11[2] == 0x2e)) {
          bVar12 = pbVar11[3];
          if ((((ulong)bVar12 < 0x21) && ((0x100002601U >> ((ulong)bVar12 & 0x3f) & 1) != 0)) ||
             (((bVar12 != 0xe2 && (bVar12 == 0xc2)) && (pbVar11[4] == 0x85)))) {
            yVar16 = YAML_DOCUMENT_END_TOKEN;
LAB_00105a49:
            iVar7 = yaml_parser_fetch_document_indicator(parser,yVar16);
            goto LAB_001053ea;
          }
        }
        break;
      case 0x3a:
        goto switchD_0010567e_caseD_3a;
      case 0x3e:
        goto switchD_0010567e_caseD_3e;
      case 0x3f:
        goto switchD_0010567e_caseD_3f;
      default:
        goto switchD_0010567e_default;
      }
      goto switchD_0010567e_caseD_24;
    }
LAB_00105796:
    if (bVar12 < 0x7c) {
      if (bVar12 < 0x60) {
        if (bVar12 == 0x5b) {
          yVar16 = YAML_FLOW_SEQUENCE_START_TOKEN;
LAB_00105934:
          iVar7 = yaml_parser_fetch_flow_collection_start(parser,yVar16);
          goto LAB_001053ea;
        }
        if (bVar12 == 0x5d) {
          yVar16 = YAML_FLOW_SEQUENCE_END_TOKEN;
LAB_001057de:
          iVar7 = yaml_parser_fetch_flow_collection_end(parser,yVar16);
          goto LAB_001053ea;
        }
      }
      else {
        if (bVar12 == 0x60) {
switchD_0010567e_caseD_20:
          if ((parser->flow_level != 0) || ((bVar12 != 0x3f && (bVar12 != 0x3a))))
          goto LAB_00106880;
          goto LAB_0010597b;
        }
        if (bVar12 == 0x7b) {
          yVar16 = YAML_FLOW_MAPPING_START_TOKEN;
          goto LAB_00105934;
        }
      }
    }
    else if (bVar12 < 0xc2) {
      if (bVar12 == 0x7c) {
        if (parser->flow_level != 0) goto LAB_00106880;
        iVar6 = 1;
        goto LAB_00105953;
      }
      if (bVar12 == 0x7d) {
        yVar16 = YAML_FLOW_MAPPING_END_TOKEN;
        goto LAB_001057de;
      }
    }
    else if ((bVar12 == 0xc2) && (pbVar11[1] == 0x85)) goto switchD_0010567e_caseD_20;
    goto switchD_0010567e_caseD_24;
  }
  if (0x5a < bVar12) goto LAB_00105796;
  switch(bVar12) {
  case 0x20:
  case 0x23:
  case 0x25:
  case 0x40:
    goto switchD_0010567e_caseD_20;
  case 0x21:
switchD_0010567e_caseD_21:
    iVar7 = yaml_parser_fetch_tag(parser);
    goto LAB_001053ea;
  case 0x22:
switchD_0010567e_caseD_22:
    iVar6 = 0;
    goto LAB_001058c4;
  case 0x24:
  case 0x28:
  case 0x29:
  case 0x2b:
  case 0x2e:
  case 0x2f:
  case 0x30:
  case 0x31:
  case 0x32:
  case 0x33:
  case 0x34:
  case 0x35:
  case 0x36:
  case 0x37:
  case 0x38:
  case 0x39:
  case 0x3b:
  case 0x3c:
  case 0x3d:
    break;
  case 0x26:
switchD_0010567e_caseD_26:
    yVar16 = YAML_ANCHOR_TOKEN;
    goto LAB_0010590e;
  case 0x27:
switchD_0010567e_caseD_27:
    iVar6 = 1;
LAB_001058c4:
    iVar7 = yaml_parser_fetch_flow_scalar(parser,iVar6);
    goto LAB_001053ea;
  case 0x2a:
switchD_0010567e_caseD_2a:
    yVar16 = YAML_ALIAS_TOKEN;
LAB_0010590e:
    iVar7 = yaml_parser_fetch_anchor(parser,yVar16);
    goto LAB_001053ea;
  case 0x2c:
switchD_0010567e_caseD_2c:
    iVar7 = yaml_parser_fetch_flow_entry(parser);
    goto LAB_001053ea;
  case 0x2d:
    bVar12 = pbVar11[1];
LAB_00105a50:
    if (((bVar12 < 0x21) && ((0x100002601U >> ((ulong)bVar12 & 0x3f) & 1) != 0)) ||
       ((bVar12 != 0xe2 && ((bVar12 == 0xc2 && (pbVar11[2] == 0x85)))))) {
      iVar7 = yaml_parser_fetch_block_entry(parser);
      goto LAB_001053ea;
    }
    break;
  case 0x3a:
switchD_0010567e_caseD_3a:
    if (parser->flow_level != 0) {
LAB_001058f9:
      iVar7 = yaml_parser_fetch_value(parser);
      goto LAB_001053ea;
    }
    bVar3 = pbVar11[1];
    if (((ulong)bVar3 < 0x21) && ((0x100002601U >> ((ulong)bVar3 & 0x3f) & 1) != 0))
    goto LAB_001058f9;
    if (bVar3 == 0xe2) goto switchD_0010567e_caseD_20;
    if (bVar3 == 0xc2) {
      if (pbVar11[2] == 0x85) goto LAB_001058f9;
      goto switchD_0010567e_caseD_20;
    }
LAB_0010597b:
    bVar12 = pbVar11[1];
    if (bVar12 == 0xc2) {
      if (pbVar11[2] == 0x85) goto LAB_00106880;
    }
    else if (((bVar12 != 0xe2) && (bVar12 < 0x21)) &&
            ((0x100002601U >> ((ulong)bVar12 & 0x3f) & 1) != 0)) {
LAB_00106880:
      parser->error = YAML_SCANNER_ERROR;
      parser->context = "while scanning for the next token";
      local_e8->column = (parser->mark).column;
      sVar14 = (parser->mark).line;
      local_e8->index = pyVar1->index;
      local_e8->line = sVar14;
      parser->problem = "found character that cannot start any token";
      local_e0->column = (parser->mark).column;
      sVar14 = (parser->mark).line;
      local_e0->index = pyVar1->index;
      local_e0->line = sVar14;
      return 0;
    }
    break;
  case 0x3e:
switchD_0010567e_caseD_3e:
    if (parser->flow_level != 0) goto LAB_00106880;
    iVar6 = 0;
LAB_00105953:
    iVar7 = yaml_parser_fetch_block_scalar(parser,iVar6);
    goto LAB_001053ea;
  case 0x3f:
switchD_0010567e_caseD_3f:
    if (parser->flow_level == 0) {
      bVar3 = pbVar11[1];
      if ((0x20 < (ulong)bVar3) || ((0x100002601U >> ((ulong)bVar3 & 0x3f) & 1) == 0)) {
        if (bVar3 != 0xe2) {
          if (bVar3 != 0xc2) goto LAB_0010597b;
          if (pbVar11[2] == 0x85) goto LAB_0010589b;
        }
        goto switchD_0010567e_caseD_20;
      }
    }
LAB_0010589b:
    iVar7 = yaml_parser_fetch_key(parser);
    goto LAB_001053ea;
  default:
switchD_0010567e_default:
    if ((bVar12 - 9 < 2) || (bVar12 == 0xd)) goto switchD_0010567e_caseD_20;
  }
switchD_0010567e_caseD_24:
  iVar7 = yaml_parser_fetch_plain_scalar(parser);
LAB_001053ea:
  if (iVar7 == 0) {
    return 0;
  }
  goto LAB_00104e1b;
}

Assistant:

YAML_DECLARE(int)
yaml_parser_fetch_more_tokens(yaml_parser_t *parser)
{
    int need_more_tokens;

    /* While we need more tokens to fetch, do it. */

    while (1)
    {
        /*
         * Check if we really need to fetch more tokens.
         */

        need_more_tokens = 0;

        if (parser->tokens.head == parser->tokens.tail)
        {
            /* Queue is empty. */

            need_more_tokens = 1;
        }
        else
        {
            yaml_simple_key_t *simple_key;

            /* Check if any potential simple key may occupy the head position. */

            if (!yaml_parser_stale_simple_keys(parser))
                return 0;

            for (simple_key = parser->simple_keys.start;
                    simple_key != parser->simple_keys.top; simple_key++) {
                if (simple_key->possible
                        && simple_key->token_number == parser->tokens_parsed) {
                    need_more_tokens = 1;
                    break;
                }
            }
        }

        /* We are finished. */

        if (!need_more_tokens)
            break;

        /* Fetch the next token. */

        if (!yaml_parser_fetch_next_token(parser))
            return 0;
    }

    parser->token_available = 1;

    return 1;
}